

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_ssse3_intr.c
# Opt level: O3

void ihevc_intra_pred_luma_ref_substitution_ssse3
               (UWORD8 *pu1_top_left,UWORD8 *pu1_top,UWORD8 *pu1_left,WORD32 src_strd,WORD32 nt,
               WORD32 nbr_flags,UWORD8 *pu1_dst,WORD32 dst_strd)

{
  uint *puVar1;
  byte bVar2;
  UWORD8 UVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  uint uVar49;
  ulong uVar50;
  UWORD8 *pUVar51;
  int iVar52;
  uint uVar53;
  ulong uVar54;
  size_t sVar55;
  uint uVar56;
  uint uVar57;
  long lVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  long lVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar66 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar67 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar68 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar69 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar70 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar71 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar72 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar73 [16];
  long lVar74;
  undefined1 in_XMM11 [16];
  long lVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  uint local_44 [5];
  
  if (nbr_flags == 0) {
    if (nt < 0) {
      return;
    }
    uVar61 = 0;
    if (0 < nt << 2) {
      uVar61 = nt << 2;
    }
    sVar55 = (size_t)(uVar61 | 1);
    uVar61 = 0x80;
    goto LAB_00133d9e;
  }
  uVar61 = nt * 2;
  lVar62 = (long)(int)uVar61;
  pu1_dst[lVar62] = *pu1_top_left;
  if (nt < 1) {
LAB_00133d0a:
    uVar59 = (uint)nbr_flags >> 0x10 & 1;
    uVar56 = (uint)nbr_flags >> 7 & 1;
    uVar60 = (uint)nbr_flags >> 8 & 1;
    uVar57 = (uint)nbr_flags >> 0xc & 1;
    if ((nbr_flags & 8U) == 0) {
      local_44[0] = uVar56;
      local_44[1] = uVar59;
      local_44[2] = uVar60;
      local_44[3] = uVar57;
      uVar53 = -nt;
      uVar49 = 0;
      uVar50 = 0;
      do {
        uVar53 = uVar53 + nt;
        uVar49 = uVar49 + nt;
        puVar1 = local_44 + uVar50;
        uVar50 = uVar50 + 1;
      } while (*puVar1 == 0);
      if (uVar50 < 3) {
        if (0 < (int)uVar49) {
          sVar55 = (size_t)uVar49;
          bVar2 = pu1_dst[sVar55];
LAB_00133dbe:
          memset(pu1_dst,(uint)bVar2,sVar55);
        }
      }
      else if (-1 < (int)uVar53) {
        sVar55 = (size_t)(uVar53 + 1);
        bVar2 = pu1_dst[(ulong)uVar53 + 1];
        goto LAB_00133dbe;
      }
    }
    auVar65 = _DAT_001721d0;
    if ((char)uVar56 == '\0' && 0 < nt) {
      uVar50 = (ulong)(uint)nt;
      UVar3 = pu1_dst[uVar50 - 1];
      lVar58 = uVar50 - 1;
      auVar77._8_4_ = (int)lVar58;
      auVar77._0_8_ = lVar58;
      auVar77._12_4_ = (int)((ulong)lVar58 >> 0x20);
      in_XMM1 = pmovsxbq(in_XMM1,0xf0e);
      in_XMM2 = pmovsxbq(in_XMM2,0xd0c);
      in_XMM3 = pmovsxbq(in_XMM3,0xb0a);
      in_XMM4 = pmovsxbq(in_XMM4,0x908);
      in_XMM5 = pmovsxbq(in_XMM5,0x706);
      in_XMM6 = pmovsxbq(in_XMM6,0x504);
      in_XMM7 = pmovsxbq(in_XMM7,0x302);
      in_XMM8 = pmovsxbq(in_XMM8,0x100);
      uVar54 = 0;
      in_XMM11 = pmovsxbq(in_XMM11,0x1010);
      do {
        auVar76 = auVar77 ^ auVar65;
        lVar58 = auVar76._0_8_;
        auVar78._0_8_ = -(ulong)(lVar58 < SUB168(in_XMM8 ^ auVar65,0));
        lVar74 = auVar76._8_8_;
        auVar78._8_8_ = -(ulong)(lVar74 < SUB168(in_XMM8 ^ auVar65,8));
        auVar102 = pshuflw(in_XMM14,auVar78,0xe8);
        auVar103._8_4_ = 0xffffffff;
        auVar103._0_8_ = 0xffffffffffffffff;
        auVar103._12_4_ = 0xffffffff;
        auVar103 = packssdw(auVar102 ^ auVar103,auVar102 ^ auVar103);
        if ((auVar103 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pu1_dst[uVar54 + uVar50] = UVar3;
        }
        auVar78 = packssdw(auVar78,auVar78);
        auVar102._8_4_ = 0xffffffff;
        auVar102._0_8_ = 0xffffffffffffffff;
        auVar102._12_4_ = 0xffffffff;
        auVar78 = packssdw(auVar78 ^ auVar102,auVar78 ^ auVar102);
        auVar78 = packsswb(auVar78,auVar78);
        if ((auVar78 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
          pu1_dst[uVar54 + uVar50 + 1] = UVar3;
        }
        auVar79._0_8_ = -(ulong)(lVar58 < SUB168(in_XMM7 ^ auVar65,0));
        auVar79._8_8_ = -(ulong)(lVar74 < SUB168(in_XMM7 ^ auVar65,8));
        auVar103 = packssdw(auVar103,auVar79);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar103 = packssdw(auVar103 ^ auVar4,auVar103 ^ auVar4);
        auVar103 = packsswb(auVar103,auVar103);
        if ((auVar103 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          pu1_dst[uVar54 + uVar50 + 2] = UVar3;
        }
        auVar78 = pshufhw(auVar79,auVar79,0x84);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar78 = packssdw(auVar78 ^ auVar5,auVar78 ^ auVar5);
        auVar78 = packsswb(auVar78,auVar78);
        if ((auVar78 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
          pu1_dst[uVar54 + uVar50 + 3] = UVar3;
        }
        auVar80._0_8_ = -(ulong)(lVar58 < SUB168(in_XMM6 ^ auVar65,0));
        auVar80._8_8_ = -(ulong)(lVar74 < SUB168(in_XMM6 ^ auVar65,8));
        auVar103 = pshuflw(auVar103,auVar80,0xe8);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar103 = packssdw(auVar103 ^ auVar6,auVar103 ^ auVar6);
        auVar103 = packsswb(auVar103,auVar103);
        if ((auVar103 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pu1_dst[uVar54 + uVar50 + 4] = UVar3;
        }
        auVar78 = packssdw(auVar80,auVar80);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar78 = packssdw(auVar78 ^ auVar7,auVar78 ^ auVar7);
        auVar78 = packsswb(auVar78,auVar78);
        if ((auVar78 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
          pu1_dst[uVar54 + uVar50 + 5] = UVar3;
        }
        auVar81._0_8_ = -(ulong)(lVar58 < SUB168(in_XMM5 ^ auVar65,0));
        auVar81._8_8_ = -(ulong)(lVar74 < SUB168(in_XMM5 ^ auVar65,8));
        auVar103 = packssdw(auVar103,auVar81);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar103 = packssdw(auVar103 ^ auVar8,auVar103 ^ auVar8);
        auVar103 = packsswb(auVar103,auVar103);
        if ((auVar103 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pu1_dst[uVar54 + uVar50 + 6] = UVar3;
        }
        auVar78 = pshufhw(auVar81,auVar81,0x84);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar78 = packssdw(auVar78 ^ auVar9,auVar78 ^ auVar9);
        auVar78 = packsswb(auVar78,auVar78);
        if ((auVar78 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
          pu1_dst[uVar54 + uVar50 + 7] = UVar3;
        }
        auVar82._0_8_ = -(ulong)(lVar58 < SUB168(in_XMM4 ^ auVar65,0));
        auVar82._8_8_ = -(ulong)(lVar74 < SUB168(in_XMM4 ^ auVar65,8));
        auVar103 = pshuflw(auVar103,auVar82,0xe8);
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        auVar103 = packssdw(auVar103 ^ auVar10,auVar103 ^ auVar10);
        auVar103 = packsswb(auVar103,auVar103);
        if ((auVar103 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pu1_dst[uVar54 + uVar50 + 8] = UVar3;
        }
        auVar78 = packssdw(auVar82,auVar82);
        auVar11._8_4_ = 0xffffffff;
        auVar11._0_8_ = 0xffffffffffffffff;
        auVar11._12_4_ = 0xffffffff;
        auVar78 = packssdw(auVar78 ^ auVar11,auVar78 ^ auVar11);
        auVar78 = packsswb(auVar78,auVar78);
        if ((auVar78 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
          pu1_dst[uVar54 + uVar50 + 9] = UVar3;
        }
        auVar83._0_8_ = -(ulong)(lVar58 < SUB168(in_XMM3 ^ auVar65,0));
        auVar83._8_8_ = -(ulong)(lVar74 < SUB168(in_XMM3 ^ auVar65,8));
        auVar103 = packssdw(auVar103,auVar83);
        auVar12._8_4_ = 0xffffffff;
        auVar12._0_8_ = 0xffffffffffffffff;
        auVar12._12_4_ = 0xffffffff;
        auVar103 = packssdw(auVar103 ^ auVar12,auVar103 ^ auVar12);
        auVar103 = packsswb(auVar103,auVar103);
        if ((auVar103 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          pu1_dst[uVar54 + uVar50 + 10] = UVar3;
        }
        auVar78 = pshufhw(auVar83,auVar83,0x84);
        auVar13._8_4_ = 0xffffffff;
        auVar13._0_8_ = 0xffffffffffffffff;
        auVar13._12_4_ = 0xffffffff;
        auVar78 = packssdw(auVar78 ^ auVar13,auVar78 ^ auVar13);
        auVar78 = packsswb(auVar78,auVar78);
        if ((auVar78 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
          pu1_dst[uVar54 + uVar50 + 0xb] = UVar3;
        }
        auVar84._0_8_ = -(ulong)(lVar58 < SUB168(in_XMM2 ^ auVar65,0));
        auVar84._8_8_ = -(ulong)(lVar74 < SUB168(in_XMM2 ^ auVar65,8));
        auVar103 = pshuflw(auVar103,auVar84,0xe8);
        auVar14._8_4_ = 0xffffffff;
        auVar14._0_8_ = 0xffffffffffffffff;
        auVar14._12_4_ = 0xffffffff;
        auVar103 = packssdw(auVar103 ^ auVar14,auVar103 ^ auVar14);
        in_XMM14 = packsswb(auVar103,auVar103);
        if ((in_XMM14 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pu1_dst[uVar54 + uVar50 + 0xc] = UVar3;
        }
        auVar103 = packssdw(auVar84,auVar84);
        auVar15._8_4_ = 0xffffffff;
        auVar15._0_8_ = 0xffffffffffffffff;
        auVar15._12_4_ = 0xffffffff;
        auVar103 = packssdw(auVar103 ^ auVar15,auVar103 ^ auVar15);
        auVar103 = packsswb(auVar103,auVar103);
        if ((auVar103 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
          pu1_dst[uVar54 + uVar50 + 0xd] = UVar3;
        }
        auVar85._0_8_ = -(ulong)(lVar58 < SUB168(in_XMM1 ^ auVar65,0));
        auVar85._8_8_ = -(ulong)(lVar74 < SUB168(in_XMM1 ^ auVar65,8));
        auVar103 = packssdw(auVar76,auVar85);
        auVar76._8_4_ = 0xffffffff;
        auVar76._0_8_ = 0xffffffffffffffff;
        auVar76._12_4_ = 0xffffffff;
        auVar103 = packssdw(auVar103 ^ auVar76,auVar103 ^ auVar76);
        auVar103 = packsswb(auVar103,auVar103);
        if ((auVar103 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pu1_dst[uVar54 + uVar50 + 0xe] = UVar3;
        }
        auVar103 = pshufhw(auVar103,auVar85,0x84);
        auVar16._8_4_ = 0xffffffff;
        auVar16._0_8_ = 0xffffffffffffffff;
        auVar16._12_4_ = 0xffffffff;
        auVar103 = packssdw(auVar103 ^ auVar16,auVar103 ^ auVar16);
        auVar103 = packsswb(auVar103,auVar103);
        if ((auVar103 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
          pu1_dst[uVar54 + uVar50 + 0xf] = UVar3;
        }
        uVar54 = uVar54 + 0x10;
        lVar58 = in_XMM8._8_8_;
        lVar74 = in_XMM11._0_8_;
        in_XMM8._0_8_ = in_XMM8._0_8_ + lVar74;
        lVar75 = in_XMM11._8_8_;
        in_XMM8._8_8_ = lVar58 + lVar75;
        lVar58 = in_XMM7._8_8_;
        in_XMM7._0_8_ = in_XMM7._0_8_ + lVar74;
        in_XMM7._8_8_ = lVar58 + lVar75;
        lVar58 = in_XMM6._8_8_;
        in_XMM6._0_8_ = in_XMM6._0_8_ + lVar74;
        in_XMM6._8_8_ = lVar58 + lVar75;
        lVar58 = in_XMM5._8_8_;
        in_XMM5._0_8_ = in_XMM5._0_8_ + lVar74;
        in_XMM5._8_8_ = lVar58 + lVar75;
        lVar58 = in_XMM4._8_8_;
        in_XMM4._0_8_ = in_XMM4._0_8_ + lVar74;
        in_XMM4._8_8_ = lVar58 + lVar75;
        lVar58 = in_XMM3._8_8_;
        in_XMM3._0_8_ = in_XMM3._0_8_ + lVar74;
        in_XMM3._8_8_ = lVar58 + lVar75;
        lVar58 = in_XMM2._8_8_;
        in_XMM2._0_8_ = in_XMM2._0_8_ + lVar74;
        in_XMM2._8_8_ = lVar58 + lVar75;
        lVar58 = in_XMM1._8_8_;
        in_XMM1._0_8_ = in_XMM1._0_8_ + lVar74;
        in_XMM1._8_8_ = lVar58 + lVar75;
      } while ((nt + 0xfU & 0xfffffff0) != uVar54);
    }
    if (uVar59 == 0) {
      pu1_dst[lVar62] = pu1_dst[lVar62 + -1];
    }
    auVar65 = _DAT_001721d0;
    if ((char)uVar60 == '\0' && 0 < nt) {
      UVar3 = pu1_dst[lVar62];
      lVar62 = (ulong)(uint)nt - 1;
      auVar63._8_4_ = (int)lVar62;
      auVar63._0_8_ = lVar62;
      auVar63._12_4_ = (int)((ulong)lVar62 >> 0x20);
      in_XMM1 = pmovsxbq(in_XMM1,0xf0e);
      in_XMM2 = pmovsxbq(in_XMM2,0xd0c);
      in_XMM3 = pmovsxbq(in_XMM3,0xb0a);
      in_XMM4 = pmovsxbq(in_XMM4,0x908);
      in_XMM5 = pmovsxbq(in_XMM5,0x706);
      in_XMM6 = pmovsxbq(in_XMM6,0x504);
      in_XMM7 = pmovsxbq(in_XMM7,0x302);
      in_XMM8 = pmovsxbq(in_XMM8,0x100);
      uVar50 = 0;
      in_XMM11 = pmovsxbq(in_XMM11,0x1010);
      do {
        auVar77 = auVar63 ^ auVar65;
        lVar62 = auVar77._0_8_;
        auVar86._0_8_ = -(ulong)(lVar62 < SUB168(in_XMM8 ^ auVar65,0));
        lVar58 = auVar77._8_8_;
        auVar86._8_8_ = -(ulong)(lVar58 < SUB168(in_XMM8 ^ auVar65,8));
        auVar103 = pshuflw(in_XMM14,auVar86,0xe8);
        auVar17._8_4_ = 0xffffffff;
        auVar17._0_8_ = 0xffffffffffffffff;
        auVar17._12_4_ = 0xffffffff;
        auVar103 = packssdw(auVar103 ^ auVar17,auVar103 ^ auVar17);
        if ((auVar103 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pu1_dst[uVar50 + (ulong)uVar61 + 1] = UVar3;
        }
        auVar76 = packssdw(auVar86,auVar86);
        auVar18._8_4_ = 0xffffffff;
        auVar18._0_8_ = 0xffffffffffffffff;
        auVar18._12_4_ = 0xffffffff;
        auVar76 = packssdw(auVar76 ^ auVar18,auVar76 ^ auVar18);
        auVar76 = packsswb(auVar76,auVar76);
        if ((auVar76 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
          pu1_dst[uVar50 + (ulong)uVar61 + 2] = UVar3;
        }
        auVar87._0_8_ = -(ulong)(lVar62 < SUB168(in_XMM7 ^ auVar65,0));
        auVar87._8_8_ = -(ulong)(lVar58 < SUB168(in_XMM7 ^ auVar65,8));
        auVar103 = packssdw(auVar103,auVar87);
        auVar19._8_4_ = 0xffffffff;
        auVar19._0_8_ = 0xffffffffffffffff;
        auVar19._12_4_ = 0xffffffff;
        auVar103 = packssdw(auVar103 ^ auVar19,auVar103 ^ auVar19);
        auVar103 = packsswb(auVar103,auVar103);
        if ((auVar103 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          pu1_dst[uVar50 + (ulong)uVar61 + 3] = UVar3;
        }
        auVar76 = pshufhw(auVar87,auVar87,0x84);
        auVar20._8_4_ = 0xffffffff;
        auVar20._0_8_ = 0xffffffffffffffff;
        auVar20._12_4_ = 0xffffffff;
        auVar76 = packssdw(auVar76 ^ auVar20,auVar76 ^ auVar20);
        auVar76 = packsswb(auVar76,auVar76);
        if ((auVar76 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
          pu1_dst[uVar50 + (ulong)uVar61 + 4] = UVar3;
        }
        auVar88._0_8_ = -(ulong)(lVar62 < SUB168(in_XMM6 ^ auVar65,0));
        auVar88._8_8_ = -(ulong)(lVar58 < SUB168(in_XMM6 ^ auVar65,8));
        auVar103 = pshuflw(auVar103,auVar88,0xe8);
        auVar21._8_4_ = 0xffffffff;
        auVar21._0_8_ = 0xffffffffffffffff;
        auVar21._12_4_ = 0xffffffff;
        auVar103 = packssdw(auVar103 ^ auVar21,auVar103 ^ auVar21);
        auVar103 = packsswb(auVar103,auVar103);
        if ((auVar103 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pu1_dst[uVar50 + (ulong)uVar61 + 5] = UVar3;
        }
        auVar76 = packssdw(auVar88,auVar88);
        auVar22._8_4_ = 0xffffffff;
        auVar22._0_8_ = 0xffffffffffffffff;
        auVar22._12_4_ = 0xffffffff;
        auVar76 = packssdw(auVar76 ^ auVar22,auVar76 ^ auVar22);
        auVar76 = packsswb(auVar76,auVar76);
        if ((auVar76 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
          pu1_dst[uVar50 + (ulong)uVar61 + 6] = UVar3;
        }
        auVar89._0_8_ = -(ulong)(lVar62 < SUB168(in_XMM5 ^ auVar65,0));
        auVar89._8_8_ = -(ulong)(lVar58 < SUB168(in_XMM5 ^ auVar65,8));
        auVar103 = packssdw(auVar103,auVar89);
        auVar23._8_4_ = 0xffffffff;
        auVar23._0_8_ = 0xffffffffffffffff;
        auVar23._12_4_ = 0xffffffff;
        auVar103 = packssdw(auVar103 ^ auVar23,auVar103 ^ auVar23);
        auVar103 = packsswb(auVar103,auVar103);
        if ((auVar103 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pu1_dst[uVar50 + (ulong)uVar61 + 7] = UVar3;
        }
        auVar76 = pshufhw(auVar89,auVar89,0x84);
        auVar24._8_4_ = 0xffffffff;
        auVar24._0_8_ = 0xffffffffffffffff;
        auVar24._12_4_ = 0xffffffff;
        auVar76 = packssdw(auVar76 ^ auVar24,auVar76 ^ auVar24);
        auVar76 = packsswb(auVar76,auVar76);
        if ((auVar76 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
          pu1_dst[uVar50 + (ulong)uVar61 + 8] = UVar3;
        }
        auVar90._0_8_ = -(ulong)(lVar62 < SUB168(in_XMM4 ^ auVar65,0));
        auVar90._8_8_ = -(ulong)(lVar58 < SUB168(in_XMM4 ^ auVar65,8));
        auVar103 = pshuflw(auVar103,auVar90,0xe8);
        auVar25._8_4_ = 0xffffffff;
        auVar25._0_8_ = 0xffffffffffffffff;
        auVar25._12_4_ = 0xffffffff;
        auVar103 = packssdw(auVar103 ^ auVar25,auVar103 ^ auVar25);
        auVar103 = packsswb(auVar103,auVar103);
        if ((auVar103 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pu1_dst[uVar50 + (ulong)uVar61 + 9] = UVar3;
        }
        auVar76 = packssdw(auVar90,auVar90);
        auVar26._8_4_ = 0xffffffff;
        auVar26._0_8_ = 0xffffffffffffffff;
        auVar26._12_4_ = 0xffffffff;
        auVar76 = packssdw(auVar76 ^ auVar26,auVar76 ^ auVar26);
        auVar76 = packsswb(auVar76,auVar76);
        if ((auVar76 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
          pu1_dst[uVar50 + (ulong)uVar61 + 10] = UVar3;
        }
        auVar91._0_8_ = -(ulong)(lVar62 < SUB168(in_XMM3 ^ auVar65,0));
        auVar91._8_8_ = -(ulong)(lVar58 < SUB168(in_XMM3 ^ auVar65,8));
        auVar103 = packssdw(auVar103,auVar91);
        auVar27._8_4_ = 0xffffffff;
        auVar27._0_8_ = 0xffffffffffffffff;
        auVar27._12_4_ = 0xffffffff;
        auVar103 = packssdw(auVar103 ^ auVar27,auVar103 ^ auVar27);
        auVar103 = packsswb(auVar103,auVar103);
        if ((auVar103 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          pu1_dst[uVar50 + (ulong)uVar61 + 0xb] = UVar3;
        }
        auVar76 = pshufhw(auVar91,auVar91,0x84);
        auVar28._8_4_ = 0xffffffff;
        auVar28._0_8_ = 0xffffffffffffffff;
        auVar28._12_4_ = 0xffffffff;
        auVar76 = packssdw(auVar76 ^ auVar28,auVar76 ^ auVar28);
        auVar76 = packsswb(auVar76,auVar76);
        if ((auVar76 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
          pu1_dst[uVar50 + (ulong)uVar61 + 0xc] = UVar3;
        }
        auVar92._0_8_ = -(ulong)(lVar62 < SUB168(in_XMM2 ^ auVar65,0));
        auVar92._8_8_ = -(ulong)(lVar58 < SUB168(in_XMM2 ^ auVar65,8));
        auVar103 = pshuflw(auVar103,auVar92,0xe8);
        auVar29._8_4_ = 0xffffffff;
        auVar29._0_8_ = 0xffffffffffffffff;
        auVar29._12_4_ = 0xffffffff;
        auVar103 = packssdw(auVar103 ^ auVar29,auVar103 ^ auVar29);
        in_XMM14 = packsswb(auVar103,auVar103);
        if ((in_XMM14 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pu1_dst[uVar50 + (ulong)uVar61 + 0xd] = UVar3;
        }
        auVar103 = packssdw(auVar92,auVar92);
        auVar30._8_4_ = 0xffffffff;
        auVar30._0_8_ = 0xffffffffffffffff;
        auVar30._12_4_ = 0xffffffff;
        auVar103 = packssdw(auVar103 ^ auVar30,auVar103 ^ auVar30);
        auVar103 = packsswb(auVar103,auVar103);
        if ((auVar103 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
          pu1_dst[uVar50 + (ulong)uVar61 + 0xe] = UVar3;
        }
        auVar93._0_8_ = -(ulong)(lVar62 < SUB168(in_XMM1 ^ auVar65,0));
        auVar93._8_8_ = -(ulong)(lVar58 < SUB168(in_XMM1 ^ auVar65,8));
        auVar77 = packssdw(auVar77,auVar93);
        auVar31._8_4_ = 0xffffffff;
        auVar31._0_8_ = 0xffffffffffffffff;
        auVar31._12_4_ = 0xffffffff;
        auVar77 = packssdw(auVar77 ^ auVar31,auVar77 ^ auVar31);
        auVar77 = packsswb(auVar77,auVar77);
        if ((auVar77 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pu1_dst[uVar50 + (ulong)uVar61 + 0xf] = UVar3;
        }
        auVar77 = pshufhw(auVar77,auVar93,0x84);
        auVar32._8_4_ = 0xffffffff;
        auVar32._0_8_ = 0xffffffffffffffff;
        auVar32._12_4_ = 0xffffffff;
        auVar77 = packssdw(auVar77 ^ auVar32,auVar77 ^ auVar32);
        auVar77 = packsswb(auVar77,auVar77);
        if ((auVar77 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
          pu1_dst[uVar50 + (ulong)uVar61 + 0x10] = UVar3;
        }
        uVar50 = uVar50 + 0x10;
        lVar62 = in_XMM8._8_8_;
        lVar58 = in_XMM11._0_8_;
        in_XMM8._0_8_ = in_XMM8._0_8_ + lVar58;
        lVar74 = in_XMM11._8_8_;
        in_XMM8._8_8_ = lVar62 + lVar74;
        lVar62 = in_XMM7._8_8_;
        in_XMM7._0_8_ = in_XMM7._0_8_ + lVar58;
        in_XMM7._8_8_ = lVar62 + lVar74;
        lVar62 = in_XMM6._8_8_;
        in_XMM6._0_8_ = in_XMM6._0_8_ + lVar58;
        in_XMM6._8_8_ = lVar62 + lVar74;
        lVar62 = in_XMM5._8_8_;
        in_XMM5._0_8_ = in_XMM5._0_8_ + lVar58;
        in_XMM5._8_8_ = lVar62 + lVar74;
        lVar62 = in_XMM4._8_8_;
        in_XMM4._0_8_ = in_XMM4._0_8_ + lVar58;
        in_XMM4._8_8_ = lVar62 + lVar74;
        lVar62 = in_XMM3._8_8_;
        in_XMM3._0_8_ = in_XMM3._0_8_ + lVar58;
        in_XMM3._8_8_ = lVar62 + lVar74;
        lVar62 = in_XMM2._8_8_;
        in_XMM2._0_8_ = in_XMM2._0_8_ + lVar58;
        in_XMM2._8_8_ = lVar62 + lVar74;
        lVar62 = in_XMM1._8_8_;
        in_XMM1._0_8_ = in_XMM1._0_8_ + lVar58;
        in_XMM1._8_8_ = lVar62 + lVar74;
      } while ((nt + 0xfU & 0xfffffff0) != uVar50);
    }
    auVar65 = _DAT_001721d0;
    if ((char)uVar57 == '\0' && 0 < nt) {
      pUVar51 = pu1_dst + (uint)(nt * 3);
      UVar3 = *pUVar51;
      lVar62 = (ulong)(uint)nt - 1;
      auVar64._8_4_ = (int)lVar62;
      auVar64._0_8_ = lVar62;
      auVar64._12_4_ = (int)((ulong)lVar62 >> 0x20);
      auVar66 = pmovsxbq(in_XMM1,0xf0e);
      auVar67 = pmovsxbq(in_XMM2,0xd0c);
      auVar68 = pmovsxbq(in_XMM3,0xb0a);
      auVar69 = pmovsxbq(in_XMM4,0x908);
      auVar70 = pmovsxbq(in_XMM5,0x706);
      auVar71 = pmovsxbq(in_XMM6,0x504);
      auVar72 = pmovsxbq(in_XMM7,0x302);
      auVar73 = pmovsxbq(in_XMM8,0x100);
      uVar50 = 0;
      auVar77 = pmovsxbq(in_XMM11,0x1010);
      do {
        auVar103 = auVar64 ^ auVar65;
        lVar62 = auVar103._0_8_;
        auVar94._0_8_ = -(ulong)(lVar62 < SUB168(auVar73 ^ auVar65,0));
        lVar58 = auVar103._8_8_;
        auVar94._8_8_ = -(ulong)(lVar58 < SUB168(auVar73 ^ auVar65,8));
        auVar76 = pshuflw(in_XMM14,auVar94,0xe8);
        auVar33._8_4_ = 0xffffffff;
        auVar33._0_8_ = 0xffffffffffffffff;
        auVar33._12_4_ = 0xffffffff;
        auVar76 = packssdw(auVar76 ^ auVar33,auVar76 ^ auVar33);
        if ((auVar76 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pUVar51[uVar50 + 1] = UVar3;
        }
        auVar78 = packssdw(auVar94,auVar94);
        auVar34._8_4_ = 0xffffffff;
        auVar34._0_8_ = 0xffffffffffffffff;
        auVar34._12_4_ = 0xffffffff;
        auVar78 = packssdw(auVar78 ^ auVar34,auVar78 ^ auVar34);
        auVar78 = packsswb(auVar78,auVar78);
        if ((auVar78 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
          pUVar51[uVar50 + 2] = UVar3;
        }
        auVar95._0_8_ = -(ulong)(lVar62 < SUB168(auVar72 ^ auVar65,0));
        auVar95._8_8_ = -(ulong)(lVar58 < SUB168(auVar72 ^ auVar65,8));
        auVar76 = packssdw(auVar76,auVar95);
        auVar35._8_4_ = 0xffffffff;
        auVar35._0_8_ = 0xffffffffffffffff;
        auVar35._12_4_ = 0xffffffff;
        auVar76 = packssdw(auVar76 ^ auVar35,auVar76 ^ auVar35);
        auVar76 = packsswb(auVar76,auVar76);
        if ((auVar76 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          pUVar51[uVar50 + 3] = UVar3;
        }
        auVar78 = pshufhw(auVar95,auVar95,0x84);
        auVar36._8_4_ = 0xffffffff;
        auVar36._0_8_ = 0xffffffffffffffff;
        auVar36._12_4_ = 0xffffffff;
        auVar78 = packssdw(auVar78 ^ auVar36,auVar78 ^ auVar36);
        auVar78 = packsswb(auVar78,auVar78);
        if ((auVar78 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
          pUVar51[uVar50 + 4] = UVar3;
        }
        auVar96._0_8_ = -(ulong)(lVar62 < SUB168(auVar71 ^ auVar65,0));
        auVar96._8_8_ = -(ulong)(lVar58 < SUB168(auVar71 ^ auVar65,8));
        auVar76 = pshuflw(auVar76,auVar96,0xe8);
        auVar37._8_4_ = 0xffffffff;
        auVar37._0_8_ = 0xffffffffffffffff;
        auVar37._12_4_ = 0xffffffff;
        auVar76 = packssdw(auVar76 ^ auVar37,auVar76 ^ auVar37);
        auVar76 = packsswb(auVar76,auVar76);
        if ((auVar76 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pUVar51[uVar50 + 5] = UVar3;
        }
        auVar78 = packssdw(auVar96,auVar96);
        auVar38._8_4_ = 0xffffffff;
        auVar38._0_8_ = 0xffffffffffffffff;
        auVar38._12_4_ = 0xffffffff;
        auVar78 = packssdw(auVar78 ^ auVar38,auVar78 ^ auVar38);
        auVar78 = packsswb(auVar78,auVar78);
        if ((auVar78 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
          pUVar51[uVar50 + 6] = UVar3;
        }
        auVar97._0_8_ = -(ulong)(lVar62 < SUB168(auVar70 ^ auVar65,0));
        auVar97._8_8_ = -(ulong)(lVar58 < SUB168(auVar70 ^ auVar65,8));
        auVar76 = packssdw(auVar76,auVar97);
        auVar39._8_4_ = 0xffffffff;
        auVar39._0_8_ = 0xffffffffffffffff;
        auVar39._12_4_ = 0xffffffff;
        auVar76 = packssdw(auVar76 ^ auVar39,auVar76 ^ auVar39);
        auVar76 = packsswb(auVar76,auVar76);
        if ((auVar76 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pUVar51[uVar50 + 7] = UVar3;
        }
        auVar78 = pshufhw(auVar97,auVar97,0x84);
        auVar40._8_4_ = 0xffffffff;
        auVar40._0_8_ = 0xffffffffffffffff;
        auVar40._12_4_ = 0xffffffff;
        auVar78 = packssdw(auVar78 ^ auVar40,auVar78 ^ auVar40);
        auVar78 = packsswb(auVar78,auVar78);
        if ((auVar78 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
          pUVar51[uVar50 + 8] = UVar3;
        }
        auVar98._0_8_ = -(ulong)(lVar62 < SUB168(auVar69 ^ auVar65,0));
        auVar98._8_8_ = -(ulong)(lVar58 < SUB168(auVar69 ^ auVar65,8));
        auVar76 = pshuflw(auVar76,auVar98,0xe8);
        auVar41._8_4_ = 0xffffffff;
        auVar41._0_8_ = 0xffffffffffffffff;
        auVar41._12_4_ = 0xffffffff;
        auVar76 = packssdw(auVar76 ^ auVar41,auVar76 ^ auVar41);
        auVar76 = packsswb(auVar76,auVar76);
        if ((auVar76 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pUVar51[uVar50 + 9] = UVar3;
        }
        auVar78 = packssdw(auVar98,auVar98);
        auVar42._8_4_ = 0xffffffff;
        auVar42._0_8_ = 0xffffffffffffffff;
        auVar42._12_4_ = 0xffffffff;
        auVar78 = packssdw(auVar78 ^ auVar42,auVar78 ^ auVar42);
        auVar78 = packsswb(auVar78,auVar78);
        if ((auVar78 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
          pUVar51[uVar50 + 10] = UVar3;
        }
        auVar99._0_8_ = -(ulong)(lVar62 < SUB168(auVar68 ^ auVar65,0));
        auVar99._8_8_ = -(ulong)(lVar58 < SUB168(auVar68 ^ auVar65,8));
        auVar76 = packssdw(auVar76,auVar99);
        auVar43._8_4_ = 0xffffffff;
        auVar43._0_8_ = 0xffffffffffffffff;
        auVar43._12_4_ = 0xffffffff;
        auVar76 = packssdw(auVar76 ^ auVar43,auVar76 ^ auVar43);
        auVar76 = packsswb(auVar76,auVar76);
        if ((auVar76 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          pUVar51[uVar50 + 0xb] = UVar3;
        }
        auVar78 = pshufhw(auVar99,auVar99,0x84);
        auVar44._8_4_ = 0xffffffff;
        auVar44._0_8_ = 0xffffffffffffffff;
        auVar44._12_4_ = 0xffffffff;
        auVar78 = packssdw(auVar78 ^ auVar44,auVar78 ^ auVar44);
        auVar78 = packsswb(auVar78,auVar78);
        if ((auVar78 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
          pUVar51[uVar50 + 0xc] = UVar3;
        }
        auVar100._0_8_ = -(ulong)(lVar62 < SUB168(auVar67 ^ auVar65,0));
        auVar100._8_8_ = -(ulong)(lVar58 < SUB168(auVar67 ^ auVar65,8));
        auVar76 = pshuflw(auVar76,auVar100,0xe8);
        auVar45._8_4_ = 0xffffffff;
        auVar45._0_8_ = 0xffffffffffffffff;
        auVar45._12_4_ = 0xffffffff;
        auVar76 = packssdw(auVar76 ^ auVar45,auVar76 ^ auVar45);
        in_XMM14 = packsswb(auVar76,auVar76);
        if ((in_XMM14 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pUVar51[uVar50 + 0xd] = UVar3;
        }
        auVar76 = packssdw(auVar100,auVar100);
        auVar46._8_4_ = 0xffffffff;
        auVar46._0_8_ = 0xffffffffffffffff;
        auVar46._12_4_ = 0xffffffff;
        auVar76 = packssdw(auVar76 ^ auVar46,auVar76 ^ auVar46);
        auVar76 = packsswb(auVar76,auVar76);
        if ((auVar76 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
          pUVar51[uVar50 + 0xe] = UVar3;
        }
        auVar101._0_8_ = -(ulong)(lVar62 < SUB168(auVar66 ^ auVar65,0));
        auVar101._8_8_ = -(ulong)(lVar58 < SUB168(auVar66 ^ auVar65,8));
        auVar103 = packssdw(auVar103,auVar101);
        auVar47._8_4_ = 0xffffffff;
        auVar47._0_8_ = 0xffffffffffffffff;
        auVar47._12_4_ = 0xffffffff;
        auVar103 = packssdw(auVar103 ^ auVar47,auVar103 ^ auVar47);
        auVar103 = packsswb(auVar103,auVar103);
        if ((auVar103 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pUVar51[uVar50 + 0xf] = UVar3;
        }
        auVar103 = pshufhw(auVar103,auVar101,0x84);
        auVar48._8_4_ = 0xffffffff;
        auVar48._0_8_ = 0xffffffffffffffff;
        auVar48._12_4_ = 0xffffffff;
        auVar103 = packssdw(auVar103 ^ auVar48,auVar103 ^ auVar48);
        auVar103 = packsswb(auVar103,auVar103);
        if ((auVar103 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
          pUVar51[uVar50 + 0x10] = UVar3;
        }
        uVar50 = uVar50 + 0x10;
        lVar62 = auVar73._8_8_;
        lVar58 = auVar77._0_8_;
        auVar73._0_8_ = auVar73._0_8_ + lVar58;
        lVar74 = auVar77._8_8_;
        auVar73._8_8_ = lVar62 + lVar74;
        lVar62 = auVar72._8_8_;
        auVar72._0_8_ = auVar72._0_8_ + lVar58;
        auVar72._8_8_ = lVar62 + lVar74;
        lVar62 = auVar71._8_8_;
        auVar71._0_8_ = auVar71._0_8_ + lVar58;
        auVar71._8_8_ = lVar62 + lVar74;
        lVar62 = auVar70._8_8_;
        auVar70._0_8_ = auVar70._0_8_ + lVar58;
        auVar70._8_8_ = lVar62 + lVar74;
        lVar62 = auVar69._8_8_;
        auVar69._0_8_ = auVar69._0_8_ + lVar58;
        auVar69._8_8_ = lVar62 + lVar74;
        lVar62 = auVar68._8_8_;
        auVar68._0_8_ = auVar68._0_8_ + lVar58;
        auVar68._8_8_ = lVar62 + lVar74;
        lVar62 = auVar67._8_8_;
        auVar67._0_8_ = auVar67._0_8_ + lVar58;
        auVar67._8_8_ = lVar62 + lVar74;
        lVar62 = auVar66._8_8_;
        auVar66._0_8_ = auVar66._0_8_ + lVar58;
        auVar66._8_8_ = lVar62 + lVar74;
      } while ((nt + 0xfU & 0xfffffff0) != uVar50);
    }
  }
  else {
    uVar50 = 1;
    if (1 < (int)uVar61) {
      uVar50 = (ulong)uVar61;
    }
    lVar58 = 0;
    do {
      pu1_dst[lVar58 + lVar62 + -1] = *pu1_left;
      pu1_left = pu1_left + src_strd;
      lVar58 = lVar58 + -1;
    } while (-lVar58 != uVar50);
    if (nt < 1) goto LAB_00133d0a;
    uVar50 = 1;
    if (1 < (int)uVar61) {
      uVar50 = (ulong)uVar61;
    }
    uVar54 = 0;
    do {
      pu1_dst[uVar54 + (ulong)uVar61 + 1] = pu1_top[uVar54];
      uVar54 = uVar54 + 1;
    } while (uVar50 != uVar54);
    if (nt < 9) goto LAB_00133d0a;
  }
  if (nt != 0x20) {
    if (nt != 0x10) {
      return;
    }
    uVar61 = (uint)nbr_flags >> 4 & 0xc | (uint)nbr_flags >> 2 & 3;
    uVar56 = (uint)nbr_flags >> 6 & 0xc0 | (uint)nbr_flags >> 4 & 0x30;
    if (uVar61 == 0) {
      uVar57 = 0x20;
      if (((uint)nbr_flags >> 0x10 & 1) == 0) {
        if (uVar56 == 0) {
          pu1_dst[0x60] = pu1_dst[0x61];
          auVar65 = pshufb(ZEXT116(pu1_dst[0x61]),(undefined1  [16])0x0);
          *(undefined1 (*) [16])pu1_dst = auVar65;
          *(undefined1 (*) [16])(pu1_dst + 0x10) = auVar65;
          *(undefined1 (*) [16])(pu1_dst + 0x20) = auVar65;
          *(undefined1 (*) [16])(pu1_dst + 0x30) = auVar65;
          *(undefined1 (*) [16])(pu1_dst + 0x40) = auVar65;
          *(undefined1 (*) [16])(pu1_dst + 0x50) = auVar65;
          return;
        }
        iVar52 = 0;
        if (uVar56 >> 4 != 0) {
          for (; ((uVar56 >> 4) >> iVar52 & 1) == 0; iVar52 = iVar52 + 1) {
          }
        }
        uVar57 = iVar52 * 8 + 0x21;
      }
    }
    else {
      iVar52 = 0;
      if (uVar61 != 0) {
        for (; (uVar61 >> iVar52 & 1) == 0; iVar52 = iVar52 + 1) {
        }
      }
      if (iVar52 == 0) {
        uVar57 = 0;
        goto LAB_001349be;
      }
      uVar57 = iVar52 << 3;
    }
    memset(pu1_dst,(uint)pu1_dst[uVar57],(ulong)uVar57);
LAB_001349be:
    uVar59 = (uint)nbr_flags >> 8 & 0x100;
    do {
      if (uVar57 == 0x20) {
        iVar52 = 1;
        if (uVar59 == 0) {
          pu1_dst[0x20] = pu1_dst[0x1f];
        }
      }
      else {
        iVar52 = 8;
        if (((uVar56 | uVar59 | uVar61) >> (uVar57 >> 3 & 0x1f) & 1) == 0) {
          *(ulong *)(pu1_dst + (int)uVar57) =
               (ulong)pu1_dst[(long)(int)uVar57 + -1] * 0x101010101010101;
        }
      }
      uVar57 = uVar57 + iVar52;
    } while ((int)uVar57 < 0x41);
    return;
  }
  uVar61 = nbr_flags & 0xff;
  if (uVar61 == 0) {
    uVar61 = 0x40;
    if (((uint)nbr_flags >> 0x10 & 1) == 0) {
      uVar61 = (uint)nbr_flags >> 8 & 0xff;
      if (uVar61 == 0) {
        uVar61 = (uint)pu1_dst[0x81];
        sVar55 = 0x81;
LAB_00133d9e:
        memset(pu1_dst,uVar61,sVar55);
        return;
      }
      iVar52 = 0;
      if (uVar61 != 0) {
        for (; (uVar61 >> iVar52 & 1) == 0; iVar52 = iVar52 + 1) {
        }
      }
      uVar61 = iVar52 * 8 + 0x41;
    }
  }
  else {
    iVar52 = 0;
    if (uVar61 != 0) {
      for (; (uVar61 >> iVar52 & 1) == 0; iVar52 = iVar52 + 1) {
      }
    }
    if (iVar52 == 0) {
      uVar61 = 0;
      goto LAB_00134a25;
    }
    uVar61 = iVar52 << 3;
  }
  memset(pu1_dst,(uint)pu1_dst[uVar61],(ulong)uVar61);
LAB_00134a25:
  do {
    if (uVar61 == 0x40) {
      iVar52 = 1;
      if (((uint)nbr_flags >> 0x10 & 1) == 0) {
        pu1_dst[0x40] = pu1_dst[0x3f];
      }
    }
    else {
      iVar52 = 8;
      if (((uint)nbr_flags >> (uVar61 >> 3 & 0x1f) & 1) == 0) {
        *(ulong *)(pu1_dst + (int)uVar61) =
             (ulong)pu1_dst[(long)(int)uVar61 + -1] * 0x101010101010101;
      }
    }
    uVar61 = uVar61 + iVar52;
  } while ((int)uVar61 < 0x81);
  return;
}

Assistant:

void ihevc_intra_pred_luma_ref_substitution_ssse3(UWORD8 *pu1_top_left,
                                                  UWORD8 *pu1_top,
                                                  UWORD8 *pu1_left,
                                                  WORD32 src_strd,
                                                  WORD32 nt,
                                                  WORD32 nbr_flags,
                                                  UWORD8 *pu1_dst,
                                                  WORD32 dst_strd)
{
    UWORD8 pu1_ref;
    WORD32 dc_val, i;
    WORD32 total_samples = (4 * nt) + 1;
    WORD32 two_nt = 2 * nt;

    WORD32 three_nt = 3 * nt;
    WORD32 get_bits;
    WORD32 next;
    WORD32 bot_left, left, top, tp_right, tp_left;

    WORD32 idx, nbr_id_from_bl, frwd_nbr_flag;
    UNUSED(dst_strd);

    dc_val = 1 << (BIT_DEPTH - 1);


    /* Neighbor Flag Structure*/
    /* MSB ---> LSB */
    /*    Top-Left | Top-Right | Top | Left | Bottom-Left
              1         4         4     4         4
     */
    /* If no neighbor flags are present, fill the neighbor samples with DC value */
    if(nbr_flags == 0)
    {
        for(i = 0; i < total_samples; i++)
        {
            pu1_dst[i] = dc_val;
        }
    }
    else
    {
        /* Else fill the corresponding samples */
        pu1_dst[two_nt] = *pu1_top_left;
        for(i = 0; i < two_nt; i++)
            pu1_dst[two_nt - 1 - i] = pu1_left[i * src_strd];
        for(i = 0; i < two_nt; i++)
            pu1_dst[two_nt + 1 + i] = pu1_top[i];

        if(nt <= 8)
        {
            /* 1 bit extraction for all the neighboring blocks */
            tp_left = (nbr_flags & 0x10000) >> 16;
            bot_left = (nbr_flags & 0x8) >> 3;
            left = (nbr_flags & 0x80) >> 7;
            top = (nbr_flags & 0x100) >> 8;
            tp_right = (nbr_flags & 0x1000) >> 12;

            next = 1;

            /* If bottom -left is not available, reverse substitution process*/
            if(bot_left == 0)
            {
                WORD32 a_nbr_flag[5] = { bot_left, left, tp_left, top, tp_right };

                /* Check for the 1st available sample from bottom-left*/
                while(!a_nbr_flag[next])
                    next++;

                /* If Left, top-left are available*/
                if(next <= 2)
                {
                    idx = nt * next;
                    pu1_ref = pu1_dst[idx];
                    for(i = 0; i < idx; i++)
                        pu1_dst[i] = pu1_ref;
                }
                else /* If top, top-right are available */
                {
                    /* Idx is changed to copy 1 pixel value for top-left ,if top-left is not available*/
                    idx = (nt * (next - 1)) + 1;
                    pu1_ref = pu1_dst[idx];
                    for(i = 0; i < idx; i++)
                        pu1_dst[i] = pu1_ref;
                }
            }

            /* Forward Substitution Process */
            /* If left is Unavailable, copy the last bottom-left value */
            if(left == 0)
            {
                for(i = 0; i < nt; i++)
                    pu1_dst[nt + i] = pu1_dst[nt - 1];
            }
            /* If top-left is Unavailable, copy the last left value */
            if(tp_left == 0)
                pu1_dst[two_nt] = pu1_dst[two_nt - 1];
            /* If top is Unavailable, copy the last top-left value */
            if(top == 0)
            {
                for(i = 0; i < nt; i++)
                    pu1_dst[two_nt + 1 + i] = pu1_dst[two_nt];
            }
            /* If to right is Unavailable, copy the last top value */
            if(tp_right == 0)
            {
                for(i = 0; i < nt; i++)
                    pu1_dst[three_nt + 1 + i] = pu1_dst[three_nt];
            }
        }

        if(nt == 16)
        {
            WORD32 nbr_flags_temp = 0;
            nbr_flags_temp = ((nbr_flags & 0xC) >> 2) + ((nbr_flags & 0xC0) >> 4)
                            + ((nbr_flags & 0x300) >> 4)
                            + ((nbr_flags & 0x3000) >> 6)
                            + ((nbr_flags & 0x10000) >> 8);

            /* compute trailing zeors based on nbr_flag for substitution process of below left see section .*/
            /* as each bit in nbr flags corresponds to 8 pels for bot_left, left, top and topright but 1 pel for topleft */
            {
                nbr_id_from_bl = look_up_trailing_zeros(nbr_flags_temp & 0XF) * 8; /* for below left and left */

                if(nbr_id_from_bl == 64)
                    nbr_id_from_bl = 32;

                if(nbr_id_from_bl == 32)
                {
                    /* for top left : 1 pel per nbr bit */
                    if(!((nbr_flags_temp >> 8) & 0x1))
                    {
                        nbr_id_from_bl++;
                        nbr_id_from_bl += look_up_trailing_zeros((nbr_flags_temp >> 4) & 0xF) * 8; /* top and top right;  8 pels per nbr bit */
                        //nbr_id_from_bl += idx * 8;
                    }
                }
                /* Reverse Substitution Process*/
                if(nbr_id_from_bl)
                {
                    /* Replicate the bottom-left and subsequent unavailable pixels with the 1st available pixel above */
                    pu1_ref = pu1_dst[nbr_id_from_bl];
                    for(i = (nbr_id_from_bl - 1); i >= 0; i--)
                    {
                        pu1_dst[i] = pu1_ref;
                    }
                }
            }

            /* for the loop of 4*Nt+1 pixels (excluding pixels computed from reverse substitution) */
            while(nbr_id_from_bl < ((T16_4NT) + 1))
            {
                /* To Obtain the next unavailable idx flag after reverse neighbor substitution  */
                /* Devide by 8 to obtain the original index */
                frwd_nbr_flag = (nbr_id_from_bl >> 3); /*+ (nbr_id_from_bl & 0x1);*/

                /* The Top-left flag is at the last bit location of nbr_flags*/
                if(nbr_id_from_bl == (T16_4NT / 2))
                {
                    get_bits = GET_BITS(nbr_flags_temp, 8);

                    /* only pel substitution for TL */
                    if(!get_bits)
                        pu1_dst[nbr_id_from_bl] = pu1_dst[nbr_id_from_bl - 1];
                }
                else
                {
                    get_bits = GET_BITS(nbr_flags_temp, frwd_nbr_flag);
                    if(!get_bits)
                    {
                        /* 8 pel substitution (other than TL) */
                        pu1_ref = pu1_dst[nbr_id_from_bl - 1];
                        for(i = 0; i < 8; i++)
                            pu1_dst[nbr_id_from_bl + i] = pu1_ref;
                    }

                }
                nbr_id_from_bl += (nbr_id_from_bl == (T16_4NT / 2)) ? 1 : 8;
            }


        }

        if(nt == 32)
        {
            /* compute trailing ones based on mbr_flag for substitution process of below left see section .*/
            /* as each bit in nbr flags corresponds to 8 pels for bot_left, left, top and topright but 1 pel for topleft */
            {
                nbr_id_from_bl = look_up_trailing_zeros((nbr_flags & 0XFF)) * 8; /* for below left and left */

                if(nbr_id_from_bl == 64)
                {
                    /* for top left : 1 pel per nbr bit */
                    if(!((nbr_flags >> 16) & 0x1))
                    {
                        /* top left not available */
                        nbr_id_from_bl++;
                        /* top and top right;  8 pels per nbr bit */
                        nbr_id_from_bl += look_up_trailing_zeros((nbr_flags >> 8) & 0xFF) * 8;
                    }
                }
                /* Reverse Substitution Process*/
                if(nbr_id_from_bl)
                {
                    /* Replicate the bottom-left and subsequent unavailable pixels with the 1st available pixel above */
                    pu1_ref = pu1_dst[nbr_id_from_bl];
                    for(i = (nbr_id_from_bl - 1); i >= 0; i--)
                        pu1_dst[i] = pu1_ref;
                }
            }

            /* for the loop of 4*Nt+1 pixels (excluding pixels computed from reverse substitution) */
            while(nbr_id_from_bl < ((T32_4NT) + 1))
            {
                /* To Obtain the next unavailable idx flag after reverse neighbor substitution  */
                /* Devide by 8 to obtain the original index */
                frwd_nbr_flag = (nbr_id_from_bl >> 3); /*+ (nbr_id_from_bl & 0x1);*/

                /* The Top-left flag is at the last bit location of nbr_flags*/
                if(nbr_id_from_bl == (T32_4NT / 2))
                {
                    get_bits = GET_BITS(nbr_flags, 16);
                    /* only pel substitution for TL */
                    if(!get_bits)
                        pu1_dst[nbr_id_from_bl] = pu1_dst[nbr_id_from_bl - 1];
                }
                else
                {
                    get_bits = GET_BITS(nbr_flags, frwd_nbr_flag);
                    if(!get_bits)
                    {
                        /* 8 pel substitution (other than TL) */
                        pu1_ref = pu1_dst[nbr_id_from_bl - 1];
                        for(i = 0; i < 8; i++)
                            pu1_dst[nbr_id_from_bl + i] = pu1_ref;
                    }

                }
                nbr_id_from_bl += (nbr_id_from_bl == (T32_4NT / 2)) ? 1 : 8;
            }
        }

    }
}